

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

void __thiscall Potassco::TheoryData::reset(TheoryData *this)

{
  long lVar1;
  uint32_t uVar2;
  RawStack<Potassco::TheoryAtom_*> *this_00;
  TheoryTerm *pTVar3;
  TheoryElement **ppTVar4;
  TheoryElement **ppTVar5;
  TheoryAtom **ppTVar6;
  TheoryAtom **ppTVar7;
  long *in_RDI;
  DestroyT destroy;
  Up local_1c [2];
  
  this_00 = (RawStack<Potassco::TheoryAtom_*> *)terms((TheoryData *)0x26e468);
  pTVar3 = terms((TheoryData *)0x26e477);
  uVar2 = numTerms((TheoryData *)0x26e485);
  std::for_each<Potassco::TheoryTerm*,Potassco::TheoryData::DestroyT>(this_00,pTVar3 + uVar2);
  ppTVar4 = elems((TheoryData *)0x26e4a6);
  ppTVar5 = elems((TheoryData *)0x26e4b5);
  uVar2 = numElems((TheoryData *)0x26e4c4);
  std::for_each<Potassco::TheoryElement**,Potassco::TheoryData::DestroyT>(ppTVar4,ppTVar5 + uVar2);
  ppTVar6 = atoms((TheoryData *)0x26e4e6);
  ppTVar7 = atoms((TheoryData *)0x26e4f5);
  uVar2 = numAtoms((TheoryData *)0x26e504);
  std::for_each<Potassco::TheoryAtom**,Potassco::TheoryData::DestroyT>(ppTVar6,ppTVar7 + uVar2);
  Data::RawStack<Potassco::TheoryAtom_*>::reset(this_00);
  Data::RawStack<Potassco::TheoryElement_*>::reset((RawStack<Potassco::TheoryElement_*> *)this_00);
  Data::RawStack<Potassco::TheoryTerm>::reset((RawStack<Potassco::TheoryTerm> *)this_00);
  Data::Up::Up(local_1c);
  lVar1 = *in_RDI;
  *(undefined8 *)(lVar1 + 0x48) = local_1c[0]._0_8_;
  *(uint32_t *)(lVar1 + 0x50) = local_1c[0].elem;
  return;
}

Assistant:

void TheoryData::reset() {
	DestroyT destroy;
	std::for_each(terms(), terms() + numTerms(), destroy);
	std::for_each(elems(), elems() + numElems(), destroy);
	std::for_each(atoms(), atoms() + numAtoms(), destroy);
	data_->atoms.reset();
	data_->elems.reset();
	data_->terms.reset();
	data_->frame = Data::Up();
}